

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O3

void leccalc::processinputfile
               (uint *samplesize,
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *event_to_periods,set<int,_std::less<int>,_std::allocator<int>_> *summaryids,
               vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
               *out_loss,bool useReturnPeriodFile,aggreports *agg)

{
  float fVar1;
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  *pvVar2;
  size_t sVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  uint uVar6;
  undefined3 in_register_00000081;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  bool bVar9;
  sampleslevelRec sr;
  sampleslevelRec sr_1;
  summarySampleslevelHeader sh;
  key_type local_84;
  uint local_78;
  int local_74;
  float local_70;
  int local_6c;
  int local_68 [2];
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  *local_60;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_58;
  _Base_ptr local_50;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_48;
  ulong local_40;
  _Base_ptr local_38;
  
  local_60 = out_loss;
  local_58 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)summaryids;
  checkinputfile(samplesize,(FILE *)_stdin,agg);
  p_Var7 = &(event_to_periods->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_78 = CONCAT31(in_register_00000081,useReturnPeriodFile) ^ 1;
  local_50 = p_Var7;
  local_48 = event_to_periods;
  uVar6 = local_78;
  do {
    sVar3 = fread(&local_6c,0xc,1,_stdin);
    if (sVar3 != 1) {
      return;
    }
    p_Var5 = (event_to_periods->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var8 = p_Var7;
    if (p_Var5 == (_Base_ptr)0x0) {
LAB_00102c0d:
      do {
        sVar3 = fread(&local_84,8,1,_stdin);
        if (sVar3 != 1) break;
      } while (local_84.summary_id != 0);
    }
    else {
      do {
        if (local_6c <= (int)p_Var5[1]._M_color) {
          p_Var8 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < local_6c];
      } while (p_Var5 != (_Base_ptr)0x0);
      if ((p_Var8 == p_Var7) || (local_6c < (int)p_Var8[1]._M_color)) goto LAB_00102c0d;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(local_58,local_68);
      while (sVar3 = fread(&local_74,8,1,_stdin), fVar1 = local_70, sVar3 == 1) {
        if (local_74 == 0) {
          sVar3 = 1;
          break;
        }
        if ((1 < local_74 + 5U) && ((local_70 <= 0.0 & (byte)uVar6) == 0)) {
          local_84.summary_id = local_68[0];
          local_84.sidx = local_74;
          p_Var5 = p_Var8[1]._M_parent;
          local_38 = p_Var8[1]._M_left;
          p_Var7 = local_50;
          event_to_periods = local_48;
          uVar6 = local_78;
          if (p_Var5 != local_38) {
            bVar9 = local_74 != -1;
            local_40 = (ulong)bVar9;
            do {
              pvVar2 = local_60;
              local_84.period_no = p_Var5->_M_color;
              pmVar4 = std::
                       map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                       ::operator[]((local_60->
                                    super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + bVar9,&local_84);
              pmVar4->agg_out_loss = pmVar4->agg_out_loss + fVar1;
              pmVar4 = std::
                       map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                       ::operator[]((pvVar2->
                                    super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + bVar9,&local_84);
              if (pmVar4->max_out_loss <= fVar1 && fVar1 != pmVar4->max_out_loss) {
                pmVar4 = std::
                         map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                         ::operator[]((map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
                                       *)((long)&(((local_60->
                                                                                                      
                                                  super__Vector_base<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->_M_t)
                                                 ._M_impl.field_0x0 +
                                         (ulong)(uint)((int)local_40 * 0x30)),&local_84);
                pmVar4->max_out_loss = fVar1;
              }
              p_Var5 = (_Base_ptr)&p_Var5->field_0x4;
              p_Var7 = local_50;
              event_to_periods = local_48;
              uVar6 = local_78;
            } while (p_Var5 != local_38);
          }
        }
      }
    }
    if (sVar3 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void processinputfile(
		unsigned int& samplesize,
		const std::map<int, std::vector<int> >& event_to_periods,
		std::set<int> &summaryids,
		std::vector<std::map<outkey2, OutLosses>> &out_loss,
		const bool useReturnPeriodFile, aggreports &agg)
	{
		checkinputfile(samplesize, stdin, agg);

		// read_event()
		size_t i = 1;
		while (i != 0) {
			summarySampleslevelHeader sh;
			i = fread(&sh, sizeof(sh), 1, stdin);
			if (i != 1) {
				break;
			}

			// discard samples if eventis not found
			std::map<int, std::vector<int> >::const_iterator iter = event_to_periods.find(sh.event_id);
			if (iter == event_to_periods.end()) { // Event not found so don't process it, but read samples
				while (i != 0) {
					sampleslevelRec sr;
					i = fread(&sr, sizeof(sr), 1, stdin);
					if (i != 1 || sr.sidx == 0) {
						break;
					}
				}
				continue;
			}

			summaryids.insert(sh.summary_id);

			// read_samples_and_compute_lec()
			while (i != 0) {
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, stdin);
				if (i != 1) {
					break;
				}

				if (sr.sidx == 0) {			//  end of sidx stream
					break;
				}

				if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) {
					continue;
				}

				if (sr.loss > 0.0 || useReturnPeriodFile)
				{
					dolecoutputaggsummary(sh.summary_id, sr.sidx, sr.loss, iter->second, out_loss);
				}
			}
		}
	}